

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoardView.cpp
# Opt level: O2

void __thiscall BoardView::ShowPartList(BoardView *this,bool *p_open)

{
  int iVar1;
  TcharStringCallback TStack_48;
  _Bind<void_(BoardView::*(BoardView_*,_std::_Placeholder<1>))(const_char_*)> local_28;
  
  if (ShowPartList(bool*)::partList == '\0') {
    iVar1 = __cxa_guard_acquire(&ShowPartList(bool*)::partList);
    if (iVar1 != 0) {
      local_28._M_f = (offset_in_BoardView_to_subr)FindComponent;
      local_28._8_8_ = 0;
      local_28._M_bound_args.super__Tuple_impl<0UL,_BoardView_*,_std::_Placeholder<1>_>.
      super__Head_base<0UL,_BoardView_*,_false>._M_head_impl =
           (_Tuple_impl<0UL,_BoardView_*,_std::_Placeholder<1>_>)
           (_Tuple_impl<0UL,_BoardView_*,_std::_Placeholder<1>_>)this;
      std::function<void(char_const*)>::
      function<std::_Bind<void(BoardView::*(BoardView*,std::_Placeholder<1>))(char_const*)>,void>
                ((function<void(char_const*)> *)&TStack_48,&local_28);
      PartList::PartList(&ShowPartList::partList,&this->keybindings,&TStack_48);
      std::_Function_base::~_Function_base(&TStack_48.super__Function_base);
      __cxa_atexit(PartList::~PartList,&ShowPartList::partList,&__dso_handle);
      __cxa_guard_release(&ShowPartList(bool*)::partList);
    }
  }
  PartList::Draw(&ShowPartList::partList,"Part List",p_open,this->m_board);
  return;
}

Assistant:

void BoardView::ShowPartList(bool *p_open) {
	static PartList partList(keybindings, std::bind(&BoardView::FindComponent, this, std::placeholders::_1));
	partList.Draw("Part List", p_open, m_board);
}